

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# space2.cpp
# Opt level: O1

int destroy_alien_proc(Am_Object *self)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  Am_Value *pAVar11;
  uint uVar12;
  ushort uVar13;
  Am_Object alien;
  Am_Object owner;
  Am_Value_List aliens;
  Am_Object local_60;
  Am_Object local_58;
  int local_50;
  int local_4c;
  Am_Object local_48;
  Am_Value_List local_40 [16];
  
  iVar3 = 0;
  uVar13 = (ushort)self;
  pAVar11 = (Am_Value *)Am_Object::Get(uVar13,0x69);
  bVar1 = Am_Value::operator_cast_to_bool(pAVar11);
  if (bVar1) {
    pAVar11 = (Am_Value *)Am_Object::Get(0x82f8,0x82);
    Am_Value_List::Am_Value_List(local_40,pAVar11);
    pAVar11 = (Am_Value *)Am_Object::Get(0x82f8,100);
    local_4c = Am_Value::operator_cast_to_int(pAVar11);
    pAVar11 = (Am_Value *)Am_Object::Get(0x82f8,0x65);
    local_50 = Am_Value::operator_cast_to_int(pAVar11);
    pAVar11 = (Am_Value *)Am_Object::Get(uVar13,0x65);
    iVar3 = Am_Value::operator_cast_to_int(pAVar11);
    pAVar11 = (Am_Value *)Am_Object::Get(uVar13,0x67);
    iVar4 = Am_Value::operator_cast_to_int(pAVar11);
    pAVar11 = (Am_Value *)Am_Object::Get(uVar13,100);
    iVar5 = Am_Value::operator_cast_to_int(pAVar11);
    pAVar11 = (Am_Value *)Am_Object::Get(uVar13,0x66);
    iVar6 = Am_Value::operator_cast_to_int(pAVar11);
    Am_Object::Get_Object((ushort)&local_48,(ulong)self);
    local_60.data = (Am_Object_Data *)0x0;
    Am_Value_List::Start();
    while( true ) {
      cVar2 = Am_Value_List::Last();
      if (cVar2 != '\0') break;
      pAVar11 = (Am_Value *)Am_Value_List::Get();
      Am_Object::operator=(&local_60,pAVar11);
      uVar13 = (ushort)&local_60;
      Am_Object::Get(uVar13,0xb0);
      cVar2 = Am_Value::Valid();
      if (cVar2 != '\0') {
        pAVar11 = (Am_Value *)Am_Object::Get(uVar13,100);
        iVar7 = Am_Value::operator_cast_to_int(pAVar11);
        pAVar11 = (Am_Value *)Am_Object::Get(uVar13,0x65);
        iVar8 = Am_Value::operator_cast_to_int(pAVar11);
        pAVar11 = (Am_Value *)Am_Object::Get(uVar13,0x66);
        iVar9 = Am_Value::operator_cast_to_int(pAVar11);
        pAVar11 = (Am_Value *)Am_Object::Get(uVar13,0x67);
        iVar10 = Am_Value::operator_cast_to_int(pAVar11);
        iVar7 = iVar7 + local_4c;
        if ((iVar5 <= iVar9 + iVar7 && iVar7 <= iVar5) ||
           (iVar6 + iVar5 <= iVar9 + iVar7 && iVar7 <= iVar6 + iVar5)) {
          iVar8 = iVar8 + local_50;
          if ((iVar8 <= iVar3 && iVar3 <= iVar10 + iVar8) ||
             (iVar8 <= iVar4 + iVar3 && iVar4 + iVar3 <= iVar10 + iVar8)) {
            Am_Object::Set((ushort)&local_60,0xb0,0);
            uVar12 = (uint)NUM_ALIENS;
            pAVar11 = (Am_Value *)Am_Object::Get(0x82f8,(ulong)uVar12);
            iVar3 = Am_Value::operator_cast_to_int(pAVar11);
            Am_Object::Set(0x82f8,uVar12,(ulong)(iVar3 - 1));
            Am_Object::Am_Object(&local_58,self);
            blot_bullet(&local_58);
            Am_Object::~Am_Object(&local_58);
            iVar3 = 0;
            goto LAB_001047ea;
          }
        }
      }
      Am_Value_List::Next();
    }
    iVar3 = 1;
LAB_001047ea:
    Am_Object::~Am_Object(&local_60);
    Am_Object::~Am_Object(&local_48);
    Am_Value_List::~Am_Value_List(local_40);
  }
  return iVar3;
}

Assistant:

Am_Define_Formula(int, destroy_alien)
{
  //  if I'm invisible, I've already destroyed something.
  if (!(bool)self.Get(Am_VISIBLE))
    return 0;

  Am_Value_List aliens = Aliens.Get(Am_GRAPHICAL_PARTS);
  int x_off = Aliens.Get(Am_LEFT);
  int y_off = Aliens.Get(Am_TOP);
  int bullet_top =
      self.Get(Am_TOP); // The ONLY Get: don't want to re-eval too often
  int bullet_bottom = bullet_top + (int)self.Get(Am_HEIGHT);
  int bullet_left = self.Get(Am_LEFT);
  int bullet_right = bullet_left + (int)self.Get(Am_WIDTH);
  int alien_left, alien_top, alien_right, alien_bottom;
  Am_Object owner = self.Get_Owner();
  Am_Object alien;
  for (aliens.Start(); !aliens.Last(); aliens.Next()) {
    alien = aliens.Get();
    if (!alien.Get(Am_IMAGE).Valid())
      continue;
    alien_left = (int)alien.Get(Am_LEFT) + x_off;
    alien_top = (int)alien.Get(Am_TOP) + y_off;
    alien_right = alien_left + (int)alien.Get(Am_WIDTH);
    alien_bottom = alien_top + (int)alien.Get(Am_HEIGHT);
    // We hit if any of the corners of the bullet are inside the alien
    if (((bullet_left >= alien_left && bullet_left <= alien_right) ||
         (bullet_right >= alien_left && bullet_right <= alien_right)) &&
        ((bullet_top <= alien_bottom && bullet_top >= alien_top) ||
         (bullet_bottom <= alien_bottom && bullet_bottom >= alien_top))) {
      alien.Set(Am_IMAGE, 0L);
      Aliens.Set(NUM_ALIENS, (int)Aliens.Get(NUM_ALIENS) - 1);

      blot_bullet(self);
      return 0;
    }
  }
  return 1;
}